

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O1

CommandOptions * read_JP2K_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  MDD_t MVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  undefined8 uVar5;
  AESDecContext *this;
  HMACContext *this_00;
  size_t sVar6;
  IFileReaderFactory *in_RDX;
  MXFReader Reader;
  ui32_t write_count;
  Result_t result;
  FrameBuffer FrameBuffer;
  RGBAEssenceDescriptor *rgba_descriptor;
  FileWriter OutFile;
  char name_format [64];
  WriterInfo Info;
  undefined1 local_650 [24];
  AESDecContext *local_638;
  long *local_630 [2];
  long local_620 [3];
  int local_608 [26];
  undefined1 local_5a0 [40];
  long *local_578 [13];
  FileWriter local_510 [56];
  long *local_4d8 [8];
  WriterInfo local_498 [5];
  
  local_650._16_8_ = Options;
  AS_02::JP2K::MXFReader::MXFReader((MXFReader *)local_650,in_RDX);
  ASDCP::JP2K::FrameBuffer::FrameBuffer
            ((FrameBuffer *)local_5a0,
             *(ui32_t *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_498,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             (allocator<char> *)local_578);
  AS_02::JP2K::MXFReader::OpenRead((string *)local_608);
  if ((byte_t *)local_498[0].ProductUUID._0_8_ != local_498[0].AssetUUID) {
    operator_delete((void *)local_498[0].ProductUUID._0_8_,local_498[0].AssetUUID._0_8_ + 1);
  }
  if (local_608[0] < 0) {
    uVar2 = 0;
  }
  else {
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      read_JP2K_file();
    }
    local_578[0] = (long *)0x0;
    local_4d8[0] = (long *)0x0;
    plVar4 = (long *)AS_02::JP2K::MXFReader::OP1aHeader();
    MVar1 = ASDCP::DefaultCompositeDict();
    uVar5 = ASDCP::Dictionary::Type(MVar1);
    (**(code **)(*plVar4 + 0xa8))(local_498,plVar4,uVar5,local_578);
    Kumu::Result_t::operator=((Result_t *)local_608,(Result_t *)local_498);
    Kumu::Result_t::~Result_t((Result_t *)local_498);
    if (local_608[0] < 0) {
      plVar4 = (long *)AS_02::JP2K::MXFReader::OP1aHeader();
      MVar1 = ASDCP::DefaultCompositeDict();
      uVar5 = ASDCP::Dictionary::Type(MVar1);
      (**(code **)(*plVar4 + 0xa8))(local_498,plVar4,uVar5,local_4d8);
      Kumu::Result_t::operator=((Result_t *)local_608,(Result_t *)local_498);
      Kumu::Result_t::~Result_t((Result_t *)local_498);
      if (local_608[0] < 0) {
        fwrite("File does not contain an essence descriptor.\n",0x2d,1,_stderr);
        AS_02::JP2K::MXFReader::AS02IndexReader();
        uVar2 = AS_02::MXF::AS02IndexReader::GetDuration();
      }
      else {
        if (local_4d8[0] == (long *)0x0) {
          __assert_fail("cdci_descriptor",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                        ,0x14f,
                        "Result_t read_JP2K_file(CommandOptions &, const Kumu::IFileReaderFactory &)"
                       );
        }
        uVar2 = 0;
        if ((char)local_4d8[0][0x20] == '\x01') {
          uVar2 = *(uint *)(local_4d8[0] + 0x1f);
        }
        if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
          (**(code **)(*local_4d8[0] + 0x88))(local_4d8[0],0);
        }
      }
    }
    else {
      if (local_578[0] == (long *)0x0) {
        __assert_fail("rgba_descriptor",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                      ,0x13e,
                      "Result_t read_JP2K_file(CommandOptions &, const Kumu::IFileReaderFactory &)")
        ;
      }
      uVar2 = 0;
      if ((char)local_578[0][0x20] == '\x01') {
        uVar2 = *(uint *)(local_578[0] + 0x1f);
      }
      if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
        (**(code **)(*local_578[0] + 0x88))(local_578[0],0);
      }
    }
    if (uVar2 == 0) {
      AS_02::JP2K::MXFReader::AS02IndexReader();
      uVar2 = AS_02::MXF::AS02IndexReader::GetDuration();
    }
    if (uVar2 == 0) {
      fwrite("Unable to determine file duration.\n",0x23,1,_stderr);
      Kumu::Result_t::Result_t((Result_t *)local_650._16_8_,(Result_t *)&Kumu::RESULT_FAIL);
      goto LAB_001094d2;
    }
  }
  if ((local_608[0] < 0) ||
     (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 1) != '\x01')) {
    local_638 = (AESDecContext *)0x0;
  }
  else {
    this = (AESDecContext *)operator_new(8);
    ASDCP::AESDecContext::AESDecContext(this);
    ASDCP::AESDecContext::InitKey(local_498[0].ProductUUID);
    Kumu::Result_t::operator=((Result_t *)local_608,(Result_t *)local_498);
    Kumu::Result_t::~Result_t((Result_t *)local_498);
    local_638 = this;
    if ((-1 < local_608[0]) &&
       (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 2) == '\x01')) {
      ASDCP::WriterInfo::WriterInfo(local_498);
      AS_02::JP2K::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
      if (local_498[0].UsesHMAC == true) {
        this_00 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_00);
        ASDCP::HMACContext::InitKey((uchar *)local_578,(LabelSet_t)this_00);
        Kumu::Result_t::operator=((Result_t *)local_608,(Result_t *)local_578);
        Kumu::Result_t::~Result_t((Result_t *)local_578);
      }
      else {
        read_JP2K_file();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0].ProductName._M_dataplus._M_p != &local_498[0].ProductName.field_2) {
        operator_delete(local_498[0].ProductName._M_dataplus._M_p,
                        local_498[0].ProductName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0].CompanyName._M_dataplus._M_p != &local_498[0].CompanyName.field_2) {
        operator_delete(local_498[0].CompanyName._M_dataplus._M_p,
                        local_498[0].CompanyName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0].ProductVersion._M_dataplus._M_p != &local_498[0].ProductVersion.field_2) {
        operator_delete(local_498[0].ProductVersion._M_dataplus._M_p,
                        local_498[0].ProductVersion.field_2._M_allocated_capacity + 1);
      }
    }
  }
  uVar3 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
  if (*(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory == 0) {
    uVar3 = uVar2;
  }
  uVar3 = uVar3 + *(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
  if (uVar2 <= uVar3) {
    uVar3 = uVar2;
  }
  snprintf((char *)local_4d8,0x40,"%%s%%0%du.j2c",
           (ulong)*(uint *)&fileReaderFactory[2]._vptr_IFileReaderFactory);
  if ((-1 < local_608[0]) &&
     (uVar2 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4), uVar2 < uVar3)) {
    do {
      AS_02::JP2K::MXFReader::ReadFrame
                ((uint)local_498,(FrameBuffer *)local_650,(AESDecContext *)(ulong)uVar2,
                 (HMACContext *)local_5a0);
      Kumu::Result_t::operator=((Result_t *)local_608,(Result_t *)local_498);
      Kumu::Result_t::~Result_t((Result_t *)local_498);
      snprintf((char *)local_498,0x400,(char *)local_4d8,
               fileReaderFactory[6]._vptr_IFileReaderFactory,(ulong)uVar2);
      if ((-1 < local_608[0]) &&
         (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01')) {
        printf("Frame %d, %d bytes",(ulong)uVar2,(ulong)(uint)local_5a0._24_4_);
        if (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0') {
          printf(" -> %s",local_498);
        }
        putchar(10);
      }
      if ((-1 < local_608[0]) &&
         (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0')) {
        Kumu::FileWriter::FileWriter(local_510);
        local_630[0] = local_620;
        sVar6 = strlen((char *)local_498);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_630,local_498,local_498[0].ProductUUID + sVar6);
        Kumu::FileWriter::OpenWrite((string *)local_578);
        Kumu::Result_t::operator=((Result_t *)local_608,(Result_t *)local_578);
        Kumu::Result_t::~Result_t((Result_t *)local_578);
        if (local_630[0] != local_620) {
          operator_delete(local_630[0],local_620[0] + 1);
        }
        if (-1 < local_608[0]) {
          Kumu::FileWriter::Write((uchar *)local_578,(uint)local_510,(uint *)local_5a0._8_8_);
          Kumu::Result_t::operator=((Result_t *)local_608,(Result_t *)local_578);
          Kumu::Result_t::~Result_t((Result_t *)local_578);
        }
        if ((-1 < local_608[0]) &&
           (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01')) {
          ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)local_5a0,(uint)_stderr);
        }
        Kumu::FileWriter::~FileWriter(local_510);
      }
    } while ((-1 < local_608[0]) && (uVar2 = uVar2 + 1, uVar2 < uVar3));
  }
  Kumu::Result_t::Result_t((Result_t *)local_650._16_8_,(Result_t *)local_608);
LAB_001094d2:
  Kumu::Result_t::~Result_t((Result_t *)local_608);
  ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)local_5a0);
  AS_02::JP2K::MXFReader::~MXFReader((MXFReader *)local_650);
  return (CommandOptions *)local_650._16_8_;
}

Assistant:

Result_t
read_JP2K_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*         Context = 0;
  HMACContext*           HMAC = 0;
  AS_02::JP2K::MXFReader Reader(fileReaderFactory);
  JP2K::FrameBuffer      FrameBuffer(Options.fb_size);
  ui32_t                 frame_count = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}

      ASDCP::MXF::RGBAEssenceDescriptor *rgba_descriptor = 0;
      ASDCP::MXF::CDCIEssenceDescriptor *cdci_descriptor = 0;

      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor),
						     reinterpret_cast<MXF::InterchangeObject**>(&rgba_descriptor));

      if ( KM_SUCCESS(result) )
	{
	  assert(rgba_descriptor);
          if ( ! rgba_descriptor->ContainerDuration.empty() )
            {
	      frame_count = (ui32_t)rgba_descriptor->ContainerDuration;
            }
	  if ( Options.verbose_flag )
	    {
	      rgba_descriptor->Dump();
	    }
	}
      else
	{
	  result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_CDCIEssenceDescriptor),
							 reinterpret_cast<MXF::InterchangeObject**>(&cdci_descriptor));

	  if ( KM_SUCCESS(result) )
	    {
	      assert(cdci_descriptor);
              if ( ! cdci_descriptor->ContainerDuration.empty() )
                {
	          frame_count = (ui32_t)cdci_descriptor->ContainerDuration;
                }
	      if ( Options.verbose_flag )
		{
		  cdci_descriptor->Dump();
		}
	    }
	  else
	    {
	      fprintf(stderr, "File does not contain an essence descriptor.\n");
	      frame_count = Reader.AS02IndexReader().GetDuration();
	    }
	}

      if ( frame_count == 0 )
	{
	  frame_count = Reader.AS02IndexReader().GetDuration();
	}

      if ( frame_count == 0 )
	{
	  fprintf(stderr, "Unable to determine file duration.\n");
	  return RESULT_FAIL;
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  ui32_t last_frame = Options.start_frame + ( Options.duration ? Options.duration : frame_count);
  if ( last_frame > frame_count )
    last_frame = frame_count;

  char name_format[64];
  snprintf(name_format,  64, "%%s%%0%du.j2c", Options.number_width);

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      char filename[1024];
      snprintf(filename, 1024, name_format, Options.file_prefix, i);

      if ( ASDCP_SUCCESS(result) && Options.verbose_flag )
	{
	  printf("Frame %d, %d bytes", i, FrameBuffer.Size());

	  if ( ! Options.no_write_flag )
	    {
	      printf(" -> %s", filename);
	    }

	  printf("\n");
	}

      if ( ASDCP_SUCCESS(result)  && ( ! Options.no_write_flag ) )
	{
	  Kumu::FileWriter OutFile;
	  ui32_t write_count;
	  result = OutFile.OpenWrite(filename);

	  if ( ASDCP_SUCCESS(result) )
	    result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);

	  if ( ASDCP_SUCCESS(result) && Options.verbose_flag )
	    {
	      FrameBuffer.Dump(stderr, Options.fb_dump_size);
	    }
	}
    }

  return result;
}